

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void decode_opc_special_r6(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  uint uVar1;
  uint rs;
  uint rd;
  uint uVar2;
  uint opc;
  uint rt;
  int iStack_40;
  
  uVar1 = (uint)(env->active_tc).gpr[7];
  rs = uVar1 >> 0x15 & 0x1f;
  rt = uVar1 >> 0x10 & 0x1f;
  rd = uVar1 >> 0xb & 0x1f;
  opc = uVar1 & 0xfc00003f;
  if (0x1a < opc - 5) {
    if ((opc == 0x35) || (opc == 0x37)) {
      gen_cond_move((DisasContext_conflict6 *)env,opc,rd,rs,rt);
      return;
    }
    goto switchD_0088a814_caseD_6;
  }
  uVar2 = uVar1 >> 6;
  switch(opc) {
  case 5:
    iStack_40 = 5;
    goto LAB_0088a92e;
  case 0xe:
    if ((*(byte *)((long)(env->active_tc).gpr + 0x62) & 0x40) == 0) {
      iStack_40 = 0x10;
      goto LAB_0088a911;
    }
    break;
  case 0x10:
  case 0x11:
    if (rt == 0 && (uVar2 & 0x1f) == 1) {
LAB_0088a8cf:
      gen_cl((DisasContext_conflict6 *)env,opc,rd,rs);
      return;
    }
    break;
  case 0x12:
  case 0x13:
    if (rt == 0 && (uVar2 & 0x1f) == 1) {
      check_mips_64((DisasContext_conflict6 *)env);
      goto LAB_0088a8cf;
    }
    break;
  case 0x15:
    check_mips_64((DisasContext_conflict6 *)env);
    uVar2 = (uint)(env->active_tc).gpr[7] >> 6;
    iStack_40 = 0x15;
LAB_0088a92e:
    gen_lsa((DisasContext_conflict6 *)env,iStack_40,rd,rs,rt,uVar2 & 3);
    return;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    if (((uVar1 & 0xfc0007ff) - 0xd8 < 4) || ((uVar1 & 0xfc0007ff) - 0x98 < 4)) {
LAB_0088a869:
      gen_r6_muldiv((DisasContext_conflict6 *)env,uVar1 & 0xfc0007ff,rd,rs,rt);
      return;
    }
    break;
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    if (((uVar1 & 0xfc0007ff) - 0xdc < 4) || ((uVar1 & 0xfc0007ff) - 0x9c < 4)) {
      check_mips_64((DisasContext_conflict6 *)env);
      goto LAB_0088a869;
    }
  }
switchD_0088a814_caseD_6:
  iStack_40 = 0x14;
LAB_0088a911:
  generate_exception_end((DisasContext_conflict6 *)env,iStack_40);
  return;
}

Assistant:

static void decode_opc_special_r6(CPUMIPSState *env, DisasContext *ctx)
{
    int rs, rt, rd, sa;
    uint32_t op1, op2;

    rs = (ctx->opcode >> 21) & 0x1f;
    rt = (ctx->opcode >> 16) & 0x1f;
    rd = (ctx->opcode >> 11) & 0x1f;
    sa = (ctx->opcode >> 6) & 0x1f;

    op1 = MASK_SPECIAL(ctx->opcode);
    switch (op1) {
    case OPC_LSA:
        gen_lsa(ctx, op1, rd, rs, rt, extract32(ctx->opcode, 6, 2));
        break;
    case OPC_MULT:
    case OPC_MULTU:
    case OPC_DIV:
    case OPC_DIVU:
        op2 = MASK_R6_MULDIV(ctx->opcode);
        switch (op2) {
        case R6_OPC_MUL:
        case R6_OPC_MUH:
        case R6_OPC_MULU:
        case R6_OPC_MUHU:
        case R6_OPC_DIV:
        case R6_OPC_MOD:
        case R6_OPC_DIVU:
        case R6_OPC_MODU:
            gen_r6_muldiv(ctx, op2, rd, rs, rt);
            break;
        default:
            MIPS_INVAL("special_r6 muldiv");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_SELEQZ:
    case OPC_SELNEZ:
        gen_cond_move(ctx, op1, rd, rs, rt);
        break;
    case R6_OPC_CLO:
    case R6_OPC_CLZ:
        if (rt == 0 && sa == 1) {
            /*
             * Major opcode and function field is shared with preR6 MFHI/MTHI.
             * We need additionally to check other fields.
             */
            gen_cl(ctx, op1, rd, rs);
        } else {
            generate_exception_end(ctx, EXCP_RI);
        }
        break;
    case R6_OPC_SDBBP:
        if (is_uhi(extract32(ctx->opcode, 6, 20))) {
            // gen_helper_do_semihosting(tcg_ctx, tcg_ctx->cpu_env);
        } else {
            if (ctx->hflags & MIPS_HFLAG_SBRI) {
                generate_exception_end(ctx, EXCP_RI);
            } else {
                generate_exception_end(ctx, EXCP_DBp);
            }
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DLSA:
        check_mips_64(ctx);
        gen_lsa(ctx, op1, rd, rs, rt, extract32(ctx->opcode, 6, 2));
        break;
    case R6_OPC_DCLO:
    case R6_OPC_DCLZ:
        if (rt == 0 && sa == 1) {
            /*
             * Major opcode and function field is shared with preR6 MFHI/MTHI.
             * We need additionally to check other fields.
             */
            check_mips_64(ctx);
            gen_cl(ctx, op1, rd, rs);
        } else {
            generate_exception_end(ctx, EXCP_RI);
        }
        break;
    case OPC_DMULT:
    case OPC_DMULTU:
    case OPC_DDIV:
    case OPC_DDIVU:

        op2 = MASK_R6_MULDIV(ctx->opcode);
        switch (op2) {
        case R6_OPC_DMUL:
        case R6_OPC_DMUH:
        case R6_OPC_DMULU:
        case R6_OPC_DMUHU:
        case R6_OPC_DDIV:
        case R6_OPC_DMOD:
        case R6_OPC_DDIVU:
        case R6_OPC_DMODU:
            check_mips_64(ctx);
            gen_r6_muldiv(ctx, op2, rd, rs, rt);
            break;
        default:
            MIPS_INVAL("special_r6 muldiv");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#endif
    default:            /* Invalid */
        MIPS_INVAL("special_r6");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}